

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPListener.cpp
# Opt level: O0

bool __thiscall hwnet::TCPListener::Start(TCPListener *this,OnNewConn *onNewConn,OnError *onError)

{
  bool bVar1;
  bool local_29;
  OnError *pOStack_28;
  bool expected;
  OnError *onError_local;
  OnNewConn *onNewConn_local;
  TCPListener *this_local;
  
  pOStack_28 = onError;
  onError_local = (OnError *)onNewConn;
  onNewConn_local = (OnNewConn *)this;
  bVar1 = std::function::operator_cast_to_bool((function *)onNewConn);
  if (bVar1) {
    bVar1 = Addr::IsVaild(&this->addr);
    if (bVar1) {
      local_29 = false;
      bVar1 = std::atomic<bool>::compare_exchange_strong
                        (&this->started,&local_29,true,memory_order_seq_cst);
      if (bVar1) {
        bVar1 = _start(this,(OnNewConn *)onError_local,pOStack_28);
        if (bVar1) {
          this_local._7_1_ = true;
        }
        else {
          std::atomic<bool>::store(&this->started,false,memory_order_seq_cst);
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool TCPListener::Start(const OnNewConn &onNewConn,const OnError &onError) {
	if(!onNewConn) {
		return false;
	}

	if(!this->addr.IsVaild()) {
		return false;
	}

	bool expected = false;
	if(!this->started.compare_exchange_strong(expected,true)) {
		return false;
	}

	if(this->_start(onNewConn,onError)){
		return true;
	} else {
		this->started.store(false);
		return false;
	}
}